

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double normal_truncated_ab_pdf(double x,double mu,double s,double a,double b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double xi_pdf;
  double xi;
  double pdf;
  double beta_cdf;
  double beta;
  double alpha_cdf;
  double alpha;
  double b_local;
  double a_local;
  double s_local;
  double mu_local;
  double x_local;
  
  dVar1 = normal_01_cdf((a - mu) / s);
  dVar2 = normal_01_cdf((b - mu) / s);
  dVar3 = normal_01_pdf((x - mu) / s);
  return (dVar3 / (dVar2 - dVar1)) / s;
}

Assistant:

double normal_truncated_ab_pdf ( double x, double mu, double s, double a, 
  double b )

//****************************************************************************80
//
//  Purpose:
//
//    NORMAL_TRUNCATED_AB_PDF evaluates the truncated Normal PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 August 2013
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Input, double MU, S, the mean and standard deviation of the
//    parent Normal distribution.
//
//    Input, double A, B, the lower and upper truncation limits.
//
//    Output, double NORMAL_TRUNCATED_AB_PDF, the value of the PDF.
//
{
  double alpha;
  double alpha_cdf;
  double beta;
  double beta_cdf;
  double pdf;
  double xi;
  double xi_pdf;

  alpha = ( a - mu ) / s;
  beta = ( b - mu ) / s;
  xi = ( x - mu ) / s;

  alpha_cdf = normal_01_cdf ( alpha );
  beta_cdf = normal_01_cdf ( beta );
  xi_pdf = normal_01_pdf ( xi );

  pdf = xi_pdf / ( beta_cdf - alpha_cdf ) / s;

  return pdf;
}